

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O2

void av1_free_pmc(PICK_MODE_CONTEXT *ctx,int num_planes)

{
  int_mv *piVar1;
  void *memblk;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  if (ctx != (PICK_MODE_CONTEXT *)0x0) {
    aom_free(ctx->blk_skip);
    ctx->blk_skip = (uint8_t *)0x0;
    aom_free(ctx->tx_type_map);
    uVar4 = 0;
    uVar2 = (ulong)(uint)num_planes;
    if (num_planes < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      ctx->coeff[uVar4] = (tran_low_t *)0x0;
      ctx->qcoeff[uVar4] = (tran_low_t *)0x0;
      ctx->dqcoeff[uVar4] = (tran_low_t *)0x0;
      aom_free(ctx->eobs[uVar4]);
      ctx->eobs[uVar4] = (uint16_t *)0x0;
      aom_free(ctx->txb_entropy_ctx[uVar4]);
      ctx->txb_entropy_ctx[uVar4] = (uint8_t *)0x0;
    }
    for (lVar3 = 0x21; lVar3 != 0x23; lVar3 = lVar3 + 1) {
      memblk = *(void **)((ctx->mic).mv + lVar3 * 2 + -2);
      if (memblk != (void *)0x0) {
        aom_free(memblk);
        piVar1 = (ctx->mic).mv + lVar3 * 2 + -2;
        piVar1[0] = (int_mv)0x0;
        piVar1[1] = (int_mv)0x0;
      }
    }
    aom_free(ctx);
    return;
  }
  return;
}

Assistant:

void av1_free_pmc(PICK_MODE_CONTEXT *ctx, int num_planes) {
  if (ctx == NULL) return;

  aom_free(ctx->blk_skip);
  ctx->blk_skip = NULL;
  aom_free(ctx->tx_type_map);
  for (int i = 0; i < num_planes; ++i) {
    ctx->coeff[i] = NULL;
    ctx->qcoeff[i] = NULL;
    ctx->dqcoeff[i] = NULL;
    aom_free(ctx->eobs[i]);
    ctx->eobs[i] = NULL;
    aom_free(ctx->txb_entropy_ctx[i]);
    ctx->txb_entropy_ctx[i] = NULL;
  }

  for (int i = 0; i < 2; ++i) {
    if (ctx->color_index_map[i]) {
      aom_free(ctx->color_index_map[i]);
      ctx->color_index_map[i] = NULL;
    }
  }

  aom_free(ctx);
}